

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O3

HCOSE_ENVELOPED COSE_Enveloped_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_Enveloped *p;
  
  p = (COSE_Enveloped *)calloc(1,0x70);
  if (p == (COSE_Enveloped *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    _Var1 = _COSE_Init(flags,(COSE *)p,0x60,perr);
    if (_Var1) {
      _COSE_InsertInList(&EnvelopedRoot,(COSE *)p);
      return (HCOSE_ENVELOPED)p;
    }
    _COSE_Enveloped_Release(p);
    free(p);
  }
  return (HCOSE_ENVELOPED)0x0;
}

Assistant:

HCOSE_ENVELOPED COSE_Enveloped_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	COSE_Enveloped * pobj = (COSE_Enveloped *)COSE_CALLOC(1, sizeof(COSE_Enveloped), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags,&pobj->m_message, COSE_enveloped_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		_COSE_Enveloped_Release(pobj);
		COSE_FREE(pobj, context);
		return NULL;
	}

	_COSE_InsertInList(&EnvelopedRoot, &pobj->m_message);

	return (HCOSE_ENVELOPED) pobj;

errorReturn:
	return NULL;
}